

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall BackwardPass::DumpMarkTemp(BackwardPass *this)

{
  BasicBlock *pBVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  BasicBlock *block;
  BackwardPass *this_local;
  
  bVar3 = IsCollectionPass(this);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x194c,"(!IsCollectionPass())","!IsCollectionPass()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pBVar1 = this->currentBlock;
  bVar3 = DoMarkTempNumbers(this);
  if (bVar3) {
    TempTracker<NumberTemp>::Dump(pBVar1->tempNumberTracker);
  }
  bVar3 = DoMarkTempObjects(this);
  if (bVar3) {
    TempTracker<ObjectTemp>::Dump(pBVar1->tempObjectTracker);
  }
  bVar3 = DoMarkTempObjectVerify(this);
  if (bVar3) {
    TempTracker<ObjectTempVerify>::Dump(pBVar1->tempObjectVerifyTracker);
  }
  return;
}

Assistant:

void
BackwardPass::DumpMarkTemp()
{
    Assert(!IsCollectionPass());

    BasicBlock * block = this->currentBlock;
    if (this->DoMarkTempNumbers())
    {
        block->tempNumberTracker->Dump();
    }
    if (this->DoMarkTempObjects())
    {
        block->tempObjectTracker->Dump();
    }
#if DBG
    if (this->DoMarkTempObjectVerify())
    {
        block->tempObjectVerifyTracker->Dump();
    }
#endif
}